

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O0

uint __thiscall glsl_type::std140_size(glsl_type *this,bool row_major)

{
  byte bVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  glsl_type *pgVar7;
  uint local_8c;
  uint local_84;
  uint local_7c;
  uint align;
  glsl_type *field_type;
  glsl_matrix_layout matrix_layout;
  uint uStack_54;
  bool field_row_major;
  uint i;
  uint max_align;
  uint size_1;
  uint size;
  uint element_base_align;
  uint stride;
  glsl_type *array_type;
  glsl_type *pgStack_30;
  uint array_len;
  glsl_type *vec_type;
  glsl_type *element_type;
  uint N;
  bool row_major_local;
  glsl_type *this_local;
  
  bVar2 = is_64bit(this);
  iVar4 = 4;
  if (bVar2) {
    iVar4 = 8;
  }
  bVar2 = is_scalar(this);
  if ((bVar2) || (bVar2 = is_vector(this), bVar2)) {
    if (this->explicit_stride != 0) {
      __assert_fail("this->explicit_stride == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                    ,0x71f,"unsigned int glsl_type::std140_size(bool) const");
    }
    this_local._4_4_ = (uint)this->vector_elements * iVar4;
  }
  else {
    pgVar7 = without_array(this);
    bVar2 = is_matrix(pgVar7);
    if (bVar2) {
      bVar2 = is_array(this);
      if (bVar2) {
        vec_type = without_array(this);
        array_type._4_4_ = arrays_of_arrays_size(this);
      }
      else {
        array_type._4_4_ = 1;
        vec_type = this;
      }
      if (row_major) {
        pgStack_30 = get_instance(*(uint *)&vec_type->field_0x4 & 0xff,
                                  (uint)vec_type->matrix_columns,1,0,false);
        bVar1 = vec_type->vector_elements;
      }
      else {
        pgStack_30 = get_instance(*(uint *)&vec_type->field_0x4 & 0xff,
                                  (uint)vec_type->vector_elements,1,0,false);
        bVar1 = vec_type->matrix_columns;
      }
      array_type._4_4_ = bVar1 * array_type._4_4_;
      pgVar7 = get_array_instance(pgStack_30,array_type._4_4_,0);
      this_local._4_4_ = std140_size(pgVar7,false);
    }
    else {
      bVar2 = is_array(this);
      if (bVar2) {
        pgVar7 = without_array(this);
        bVar2 = is_struct(pgVar7);
        if (bVar2) {
          pgVar7 = without_array(this);
          size = std140_size(pgVar7,row_major);
        }
        else {
          pgVar7 = without_array(this);
          local_7c = std140_base_alignment(pgVar7,row_major);
          if (local_7c < 0x11) {
            local_7c = 0x10;
          }
          size = local_7c;
        }
        uVar5 = arrays_of_arrays_size(this);
        this_local._4_4_ = uVar5 * size;
        bVar2 = true;
        if (this->explicit_stride != 0) {
          bVar2 = this_local._4_4_ == this->length * this->explicit_stride;
        }
        if (!bVar2) {
          __assert_fail("this->explicit_stride == 0 || size == this->length * this->explicit_stride"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                        ,0x768,"unsigned int glsl_type::std140_size(bool) const");
        }
      }
      else {
        bVar2 = is_struct(this);
        if ((!bVar2) && (bVar2 = is_interface(this), !bVar2)) {
          __assert_fail("!\"not reached\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                        ,0x799,"unsigned int glsl_type::std140_size(bool) const");
        }
        i = 0;
        uStack_54 = 0;
        for (matrix_layout = GLSL_MATRIX_LAYOUT_INHERITED; matrix_layout < this->length;
            matrix_layout = matrix_layout + GLSL_MATRIX_LAYOUT_COLUMN_MAJOR) {
          uVar3 = *(ushort *)&(this->fields).array[matrix_layout].fields >> 5 & 3;
          if (uVar3 == 2) {
            field_type._7_1_ = true;
          }
          else {
            field_type._7_1_ = row_major;
            if (uVar3 == 1) {
              field_type._7_1_ = false;
            }
          }
          pgVar7 = *(glsl_type **)((this->fields).array + matrix_layout);
          local_84 = std140_base_alignment(pgVar7,field_type._7_1_);
          bVar2 = is_unsized_array(pgVar7);
          if (!bVar2) {
            uVar5 = glsl_align(i,local_84);
            uVar6 = std140_size(pgVar7,field_type._7_1_);
            i = uVar6 + uVar5;
            if (local_84 <= uStack_54) {
              local_84 = uStack_54;
            }
            uStack_54 = local_84;
            bVar2 = is_struct(pgVar7);
            if ((bVar2) && (matrix_layout + GLSL_MATRIX_LAYOUT_COLUMN_MAJOR < this->length)) {
              i = glsl_align(i,0x10);
            }
          }
        }
        if (uStack_54 < 0x11) {
          local_8c = 0x10;
        }
        else {
          local_8c = uStack_54;
        }
        this_local._4_4_ = glsl_align(i,local_8c);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned
glsl_type::std140_size(bool row_major) const
{
   unsigned N = is_64bit() ? 8 : 4;

   /* (1) If the member is a scalar consuming <N> basic machine units, the
    *     base alignment is <N>.
    *
    * (2) If the member is a two- or four-component vector with components
    *     consuming <N> basic machine units, the base alignment is 2<N> or
    *     4<N>, respectively.
    *
    * (3) If the member is a three-component vector with components consuming
    *     <N> basic machine units, the base alignment is 4<N>.
    */
   if (this->is_scalar() || this->is_vector()) {
      assert(this->explicit_stride == 0);
      return this->vector_elements * N;
   }

   /* (5) If the member is a column-major matrix with <C> columns and
    *     <R> rows, the matrix is stored identically to an array of
    *     <C> column vectors with <R> components each, according to
    *     rule (4).
    *
    * (6) If the member is an array of <S> column-major matrices with <C>
    *     columns and <R> rows, the matrix is stored identically to a row of
    *     <S>*<C> column vectors with <R> components each, according to rule
    *     (4).
    *
    * (7) If the member is a row-major matrix with <C> columns and <R>
    *     rows, the matrix is stored identically to an array of <R>
    *     row vectors with <C> components each, according to rule (4).
    *
    * (8) If the member is an array of <S> row-major matrices with <C> columns
    *     and <R> rows, the matrix is stored identically to a row of <S>*<R>
    *     row vectors with <C> components each, according to rule (4).
    */
   if (this->without_array()->is_matrix()) {
      const struct glsl_type *element_type;
      const struct glsl_type *vec_type;
      unsigned int array_len;

      if (this->is_array()) {
         element_type = this->without_array();
         array_len = this->arrays_of_arrays_size();
      } else {
         element_type = this;
         array_len = 1;
      }

      if (row_major) {
         vec_type = get_instance(element_type->base_type,
                                 element_type->matrix_columns, 1);

         array_len *= element_type->vector_elements;
      } else {
         vec_type = get_instance(element_type->base_type,
                                 element_type->vector_elements, 1);
         array_len *= element_type->matrix_columns;
      }
      const glsl_type *array_type = glsl_type::get_array_instance(vec_type,
                                                                  array_len);

      return array_type->std140_size(false);
   }

   /* (4) If the member is an array of scalars or vectors, the base alignment
    *     and array stride are set to match the base alignment of a single
    *     array element, according to rules (1), (2), and (3), and rounded up
    *     to the base alignment of a vec4. The array may have padding at the
    *     end; the base offset of the member following the array is rounded up
    *     to the next multiple of the base alignment.
    *
    * (10) If the member is an array of <S> structures, the <S> elements of
    *      the array are laid out in order, according to rule (9).
    */
   if (this->is_array()) {
      unsigned stride;
      if (this->without_array()->is_struct()) {
	 stride = this->without_array()->std140_size(row_major);
      } else {
	 unsigned element_base_align =
	    this->without_array()->std140_base_alignment(row_major);
         stride = MAX2(element_base_align, 16);
      }

      unsigned size = this->arrays_of_arrays_size() * stride;
      assert(this->explicit_stride == 0 ||
             size == this->length * this->explicit_stride);
      return size;
   }

   /* (9) If the member is a structure, the base alignment of the
    *     structure is <N>, where <N> is the largest base alignment
    *     value of any of its members, and rounded up to the base
    *     alignment of a vec4. The individual members of this
    *     sub-structure are then assigned offsets by applying this set
    *     of rules recursively, where the base offset of the first
    *     member of the sub-structure is equal to the aligned offset
    *     of the structure. The structure may have padding at the end;
    *     the base offset of the member following the sub-structure is
    *     rounded up to the next multiple of the base alignment of the
    *     structure.
    */
   if (this->is_struct() || this->is_interface()) {
      unsigned size = 0;
      unsigned max_align = 0;

      for (unsigned i = 0; i < this->length; i++) {
         bool field_row_major = row_major;
         const enum glsl_matrix_layout matrix_layout =
            glsl_matrix_layout(this->fields.structure[i].matrix_layout);
         if (matrix_layout == GLSL_MATRIX_LAYOUT_ROW_MAJOR) {
            field_row_major = true;
         } else if (matrix_layout == GLSL_MATRIX_LAYOUT_COLUMN_MAJOR) {
            field_row_major = false;
         }

         const struct glsl_type *field_type = this->fields.structure[i].type;
         unsigned align = field_type->std140_base_alignment(field_row_major);

         /* Ignore unsized arrays when calculating size */
         if (field_type->is_unsized_array())
            continue;

         size = glsl_align(size, align);
         size += field_type->std140_size(field_row_major);

         max_align = MAX2(align, max_align);

         if (field_type->is_struct() && (i + 1 < this->length))
            size = glsl_align(size, 16);
      }
      size = glsl_align(size, MAX2(max_align, 16));
      return size;
   }

   assert(!"not reached");
   return -1;
}